

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall CFFEmbeddedFontWriter::UpdateIndexesAtTopDict(CFFEmbeddedFontWriter *this)

{
  EStatusCode EVar1;
  CFFEmbeddedFontWriter *this_local;
  
  OutputStringBufferStream::SetPosition(&this->mFontFileStream,this->mCharsetPlaceHolderPosition);
  CFFPrimitiveWriter::Write5ByteDictInteger(&this->mPrimitivesWriter,this->mCharsetPosition);
  OutputStringBufferStream::SetPosition
            (&this->mFontFileStream,this->mCharstringsPlaceHolderPosition);
  CFFPrimitiveWriter::Write5ByteDictInteger(&this->mPrimitivesWriter,this->mCharStringPosition);
  if (((this->mOpenTypeInput).mCFF.mPrivateDicts)->mPrivateDictStart != 0) {
    OutputStringBufferStream::SetPosition(&this->mFontFileStream,this->mPrivatePlaceHolderPosition);
    CFFPrimitiveWriter::Write5ByteDictInteger(&this->mPrimitivesWriter,this->mPrivateSize);
    CFFPrimitiveWriter::Write5ByteDictInteger(&this->mPrimitivesWriter,this->mPrivatePosition);
  }
  if ((this->mIsCID & 1U) == 0) {
    OutputStringBufferStream::SetPosition(&this->mFontFileStream,this->mEncodingPlaceHolderPosition)
    ;
    CFFPrimitiveWriter::Write5ByteDictInteger(&this->mPrimitivesWriter,this->mEncodingPosition);
  }
  else {
    OutputStringBufferStream::SetPosition(&this->mFontFileStream,this->mFDArrayPlaceHolderPosition);
    CFFPrimitiveWriter::Write5ByteDictInteger(&this->mPrimitivesWriter,this->mFDArrayPosition);
    OutputStringBufferStream::SetPosition(&this->mFontFileStream,this->mFDSelectPlaceHolderPosition)
    ;
    CFFPrimitiveWriter::Write5ByteDictInteger(&this->mPrimitivesWriter,this->mFDSelectPosition);
  }
  EVar1 = CFFPrimitiveWriter::GetInternalState(&this->mPrimitivesWriter);
  return EVar1;
}

Assistant:

EStatusCode CFFEmbeddedFontWriter::UpdateIndexesAtTopDict()
{
	mFontFileStream.SetPosition(mCharsetPlaceHolderPosition);
	mPrimitivesWriter.Write5ByteDictInteger((long)mCharsetPosition);

	mFontFileStream.SetPosition(mCharstringsPlaceHolderPosition);
	mPrimitivesWriter.Write5ByteDictInteger((long)mCharStringPosition);

	if(mOpenTypeInput.mCFF.mPrivateDicts[0].mPrivateDictStart != 0)
	{
		mFontFileStream.SetPosition(mPrivatePlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mPrivateSize);
		mPrimitivesWriter.Write5ByteDictInteger((long)mPrivatePosition);
		
	}
	
	if(mIsCID)
	{
		mFontFileStream.SetPosition(mFDArrayPlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mFDArrayPosition);
		mFontFileStream.SetPosition(mFDSelectPlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mFDSelectPosition);
	}
	else
	{
		mFontFileStream.SetPosition(mEncodingPlaceHolderPosition);
		mPrimitivesWriter.Write5ByteDictInteger((long)mEncodingPosition);
	}

	return mPrimitivesWriter.GetInternalState();
}